

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O2

int combine_prior_with_tpl_boost
              (double min_factor,double max_factor,int prior_boost,int tpl_boost,int frames_to_key)

{
  double dVar1;
  
  dVar1 = (double)frames_to_key;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (12.0 <= dVar1) {
    dVar1 = 12.0;
  }
  if (dVar1 <= min_factor) {
    dVar1 = min_factor;
  }
  return (int)(((double)prior_boost * (dVar1 - min_factor) +
               (double)tpl_boost * ((12.0 - min_factor) - (dVar1 - min_factor))) /
              (12.0 - min_factor));
}

Assistant:

static inline int combine_prior_with_tpl_boost(double min_factor,
                                               double max_factor,
                                               int prior_boost, int tpl_boost,
                                               int frames_to_key) {
  double factor = sqrt((double)frames_to_key);
  double range = max_factor - min_factor;
  factor = AOMMIN(factor, max_factor);
  factor = AOMMAX(factor, min_factor);
  factor -= min_factor;
  int boost =
      (int)((factor * prior_boost + (range - factor) * tpl_boost) / range);
  return boost;
}